

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

bool xercesc_4_0::XMLUri::isConformantSchemeName(XMLCh *scheme)

{
  bool bVar1;
  int iVar2;
  XMLCh *local_20;
  XMLCh *tmpStr;
  XMLCh *scheme_local;
  
  if (scheme == (XMLCh *)0x0) {
    scheme_local._7_1_ = false;
  }
  else {
    bVar1 = XMLString::isAlpha(*scheme);
    if (bVar1) {
      for (local_20 = scheme + 1; *local_20 != L'\0'; local_20 = local_20 + 1) {
        bVar1 = XMLString::isAlphaNum(*local_20);
        if ((!bVar1) && (iVar2 = XMLString::indexOf(L"+-.",*local_20), iVar2 == -1)) {
          return false;
        }
      }
      scheme_local._7_1_ = true;
    }
    else {
      scheme_local._7_1_ = false;
    }
  }
  return scheme_local._7_1_;
}

Assistant:

bool XMLUri::isConformantSchemeName(const XMLCh* const scheme)
{
	if ( !scheme )
        return false;

    const XMLCh* tmpStr = scheme;
    if (!XMLString::isAlpha(*tmpStr))     // first: alpha
        return false;

    // second onwards: ( alpha | digit | "+" | "-" | "." )
    tmpStr++;
    while (*tmpStr)
    {
        if ( !XMLString::isAlphaNum(*tmpStr) &&
             (XMLString::indexOf(SCHEME_CHARACTERS, *tmpStr) == -1))
            return false;

        tmpStr++;
    }

    return true;
}